

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyText
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  byte bVar1;
  int iVar2;
  Plausibility PVar3;
  char cVar4;
  ulong uVar5;
  char *__begin2;
  size_t sVar6;
  Plausibility in_R9D;
  int iVar7;
  bool bVar8;
  
  PVar3 = PLAUSIBLE;
  if (prefix.size_ != 0) {
    sVar6 = 0;
    iVar7 = 0;
    do {
      bVar1 = prefix.ptr[sVar6];
      uVar5 = (ulong)bVar1;
      PVar3 = in_R9D;
      if (iVar7 == 2) {
        cVar4 = '\x01';
        iVar2 = 2;
        PVar3 = PLAUSIBLE;
        if ((bVar1 != 0x22) && (bVar1 != 0x27)) {
LAB_0012079d:
          bVar8 = (bVar1 & 0xfb) != 9;
          cVar4 = bVar1 == 0x7f || bVar1 != 0xb && ((bVar1 != 10 && bVar1 < 0x20) && bVar8);
          iVar2 = iVar7;
          PVar3 = in_R9D;
          if (bVar1 == 0x7f || bVar1 != 0xb && ((bVar1 != 10 && bVar1 < 0x20) && bVar8)) {
            PVar3 = IMPOSSIBLE;
          }
        }
      }
      else if (iVar7 == 1) {
        if (bVar1 != 10) goto LAB_0012079d;
        cVar4 = '\x03';
        iVar2 = 0;
      }
      else if (bVar1 < 0x29) {
        if ((0x100002e00U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0012079d;
        cVar4 = '\x03';
        if (uVar5 == 0x23) {
          iVar2 = 1;
        }
        else {
          iVar2 = 2;
          cVar4 = '\x03';
          if (uVar5 != 0x28) goto LAB_00120820;
        }
      }
      else {
LAB_00120820:
        cVar4 = '\x01';
        iVar2 = 0;
        PVar3 = IMPOSSIBLE;
      }
      in_R9D = PVar3;
      iVar7 = iVar2;
    } while (((cVar4 == '\x03') || (PVar3 = in_R9D, cVar4 == '\0')) &&
            (sVar6 = sVar6 + 1, PVar3 = PLAUSIBLE, prefix.size_ != sVar6));
  }
  return PVar3;
}

Assistant:

Plausibility isPlausiblyText(kj::ArrayPtr<const byte> prefix) {
    enum { PREAMBLE, COMMENT, BODY } state = PREAMBLE;

    for (char c: prefix.asChars()) {
      switch (state) {
        case PREAMBLE:
          // Before opening parenthesis.
          switch (c) {
            case '(': state = BODY; continue;
            case '#': state = COMMENT; continue;
            case ' ':
            case '\n':
            case '\r':
            case '\t':
            case '\v':
              // whitespace
              break;
            default:
              // Not whitespace, not comment, not open parenthesis. Impossible!
              return IMPOSSIBLE;
          }
          break;
        case COMMENT:
          switch (c) {
            case '\n': state = PREAMBLE; continue;
            default: break;
          }
          break;
        case BODY:
          switch (c) {
            case '\"':
            case '\'':
              // String literal. Let's stop here before things get complicated.
              return PLAUSIBLE;
            default:
              break;
          }
          break;
      }

      if ((static_cast<uint8_t>(c) < 0x20 && c != '\n' && c != '\r' && c != '\t' && c != '\v')
          || c == 0x7f) {
        // Unprintable character.
        return IMPOSSIBLE;
      }
    }

    return PLAUSIBLE;
  }